

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

void stbtt__dict_get_ints(stbtt__buf *b,int key,int outcount,stbtt_uint32 *out)

{
  byte *pbVar1;
  uchar *puVar2;
  uint uVar3;
  stbtt_uint32 sVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  stbtt__buf operands;
  stbtt__buf local_40;
  
  uVar3 = b->size;
  uVar7 = 0;
  if ((int)uVar3 < 0) {
    uVar7 = uVar3;
  }
  b->cursor = uVar7;
  if ((int)uVar3 < 1) {
    return;
  }
  do {
    uVar10 = 0;
    if ((int)uVar7 < (int)uVar3) {
      uVar6 = (ulong)uVar7;
      do {
        puVar2 = b->data;
        uVar5 = (uint)uVar6;
        lVar8 = (long)(int)uVar5;
        if (puVar2[lVar8] < 0x1c) {
          uVar9 = lVar8 + 1;
          b->cursor = (int)uVar9;
          uVar10 = (uint)puVar2[lVar8];
          if ((puVar2[lVar8] == 0xc) && (uVar10 = 0x100, (int)uVar9 < (int)uVar3)) {
            b->cursor = uVar5 + 2;
            pbVar1 = puVar2 + uVar9;
            uVar9 = (ulong)(uVar5 + 2);
            uVar10 = *pbVar1 | 0x100;
          }
          goto LAB_00249112;
        }
        if (puVar2[lVar8] == 0x1e) {
          uVar10 = uVar5 + 1;
          if ((int)uVar5 < -1) {
            uVar10 = uVar3;
          }
          uVar6 = (ulong)uVar10;
          b->cursor = uVar10;
          uVar5 = uVar3;
          if ((int)uVar3 < (int)uVar10) {
            uVar5 = uVar10;
          }
          if ((int)uVar10 < (int)uVar3) {
            uVar9 = (long)(int)uVar10;
            do {
              uVar6 = uVar9 + 1;
              b->cursor = (int)uVar9 + 1;
              if (((~puVar2[uVar9] & 0xf) == 0) || ((puVar2[uVar9] & 0xf0) == 0xf0)) break;
              bVar11 = (long)(int)uVar5 - 1U != uVar9;
              uVar9 = uVar6;
            } while (bVar11);
          }
        }
        else {
          stbtt__cff_int(b);
          uVar6 = (ulong)(uint)b->cursor;
          uVar3 = b->size;
        }
      } while ((int)(uint)uVar6 < (int)uVar3);
      uVar9 = uVar6 & 0xffffffff;
      uVar10 = 0;
      uVar5 = (uint)uVar6;
    }
    else {
      uVar9 = (ulong)uVar7;
      uVar5 = uVar7;
    }
LAB_00249112:
    if (uVar10 == key) {
      if ((int)(uVar5 - uVar7 | uVar7) < 0) {
        return;
      }
      if ((int)uVar3 < (int)uVar7) {
        return;
      }
      if ((int)uVar3 < (int)uVar5) {
        return;
      }
      local_40.data = b->data + uVar7;
      local_40._8_8_ = (ulong)(uVar5 - uVar7) << 0x20;
      if (outcount < 1) {
        return;
      }
      if (uVar5 == uVar7) {
        return;
      }
      uVar9 = 1;
      do {
        sVar4 = stbtt__cff_int(&local_40);
        out[uVar9 - 1] = sVar4;
        if ((uint)outcount <= uVar9) {
          return;
        }
        uVar9 = uVar9 + 1;
      } while (local_40.cursor < local_40.size);
      return;
    }
    uVar7 = (uint)uVar9;
    if ((int)uVar3 <= (int)uVar7) {
      return;
    }
  } while( true );
}

Assistant:

static void stbtt__buf_seek(stbtt__buf *b, int o)
{
   STBTT_assert(!(o > b->size || o < 0));
   b->cursor = (o > b->size || o < 0) ? b->size : o;
}